

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

HashErr insert_symbol(SymbolTable *s,char *name,SymbolInfo val)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  Bucket *__ptr;
  char cVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  Symbol *pSVar8;
  
  cVar1 = *name;
  if (cVar1 == '\0') {
    uVar6 = 0;
  }
  else {
    pcVar3 = name + 1;
    uVar6 = 0;
    cVar4 = cVar1;
    do {
      uVar6 = uVar6 + (long)cVar4;
      uVar6 = (uVar6 >> 2) + (long)cVar4 + uVar6 * 8;
      cVar4 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar4 != '\0');
    uVar6 = uVar6 % 0xfd;
  }
  __ptr = s->bucket[uVar6];
  iVar5 = __ptr->num_symbols;
  if (0 < iVar5) {
    pSVar8 = __ptr->symbol;
    iVar7 = iVar5 + 1;
    do {
      if ((cVar1 == *pSVar8->name) && (iVar2 = strcmp(name,pSVar8->name), iVar2 == 0)) {
        return HASH_DUPLICATE;
      }
      pSVar8 = pSVar8 + 1;
      iVar7 = iVar7 + -1;
    } while (1 < iVar7);
  }
  iVar7 = __ptr->max_symbols;
  if (iVar7 <= iVar5) {
    __ptr->max_symbols = iVar7 * 2;
    __ptr = (Bucket *)realloc(__ptr,(long)iVar7 << 5 | 8);
    s->bucket[uVar6] = __ptr;
    iVar5 = __ptr->num_symbols;
  }
  __ptr->num_symbols = iVar5 + 1;
  __ptr->symbol[iVar5].name = name;
  __ptr->symbol[iVar5].value = val;
  return HASH_NOERR;
}

Assistant:

HashErr
insert_symbol (SymbolTable *s, const char *name, SymbolInfo val)
{
  int i, bucket_num = hash_code (name);
  Symbol *sym;
  Bucket *b;
  char firstc = *name;

  b = s->bucket[bucket_num];
  
  /* First, check for a duplicate. */
  for (i = b->num_symbols, sym = &b->symbol[0]; i > 0; sym++, i--)
    if (firstc == sym->name[0] && !strcmp (name, sym->name))
      return HASH_DUPLICATE;

  /* If there isn't room, double the size of the bucket. */
  if (b->num_symbols >= b->max_symbols)
    {
      b->max_symbols *= 2;
      b = s->bucket[bucket_num] =
	(Bucket *) realloc (b, sizeof *b + ((b->max_symbols - INITIAL_SYMBOLS)
					    * sizeof (Symbol)));
    }

  sym = &b->symbol[b->num_symbols++];
  sym->name = name;
  sym->value = val;

  return HASH_NOERR;
}